

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O1

Utest * __thiscall
TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_TestShell::createTest
          (TEST_JUnitOutputTest_twoTestGroupsWriteToTwoDifferentFiles_TestShell *this)

{
  Utest *this_00;
  
  this_00 = (Utest *)operator_new(0x28,
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/offa[P]cpputest/tests/CppUTest/JUnitOutputTest.cpp"
                                  ,0x26d);
  this_00->_vptr_Utest = (_func_int **)0x0;
  this_00[1]._vptr_Utest = (_func_int **)0x0;
  this_00[2]._vptr_Utest = (_func_int **)0x0;
  this_00[3]._vptr_Utest = (_func_int **)0x0;
  this_00[4]._vptr_Utest = (_func_int **)0x0;
  Utest::Utest(this_00);
  this_00->_vptr_Utest = (_func_int **)&PTR__Utest_0034ab60;
  return this_00;
}

Assistant:

TEST(JUnitOutputTest, twoTestGroupsWriteToTwoDifferentFiles)
{
    testCaseRunner->start()
            .withGroup("firstTestGroup")
                .withTest("testName")
            .withGroup("secondTestGroup")
                .withTest("testName")
            .end();

    CHECK(fileSystem.file("cpputest_firstTestGroup.xml") != NULLPTR);
    CHECK(fileSystem.file("cpputest_secondTestGroup.xml") != NULLPTR);

}